

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeImage
                 (qpTestLog *log,char *name,char *description,qpImageCompressionMode compressionMode
                 ,qpImageFormat imageFormat,int width,int height,int stride,void *data)

{
  int iVar1;
  deBool dVar2;
  png_byte **rowPointers;
  png_structp png;
  png_infop info;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  size_t local_1b0;
  Buffer compressedBuffer;
  char widthStr [32];
  qpXmlAttribute attribs [8];
  char heightStr [32];
  
  if ((log->flags & 1) != 0) {
    return 1;
  }
  compressedBuffer.data = (deUint8 *)0x0;
  compressedBuffer.capacity = 0;
  compressedBuffer.size = 0;
  if (compressionMode - QP_IMAGE_COMPRESSION_MODE_PNG < 2) {
    rowPointers = (png_byte **)deMalloc((long)height << 3);
    if (rowPointers == (png_byte **)0x0) {
LAB_007e4746:
      qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
      goto LAB_007e4761;
    }
    iVar1 = 0;
    uVar3 = 0;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      rowPointers[uVar4] = (png_byte *)((long)data + (long)iVar1);
      iVar1 = iVar1 + stride;
    }
    info = (png_infop)0x0;
    png = (png_structp)png_create_write_struct("1.6.37",0,0,0);
    attribs[0].name = (char *)png;
    if (png != (png_structp)0x0) {
      info = (png_infop)png_create_info_struct(png);
    }
    widthStr._0_8_ = info;
    if (info == (png_infop)0x0 || png == (png_structp)0x0) {
      if (png != (png_structp)0x0) {
        png_destroy_write_struct(attribs,widthStr);
      }
      deFree(rowPointers);
      goto LAB_007e4746;
    }
    png_set_write_fn(png,&compressedBuffer,pngWriteData,pngFlushData);
    dVar2 = writeCompressedPNG(png,info,rowPointers,width,height,
                               (uint)(imageFormat == QP_IMAGE_FORMAT_RGBA8888) * 4 + 2);
    png_destroy_info_struct(png,widthStr);
    png_destroy_write_struct(attribs,0);
    deFree(rowPointers);
    if (dVar2 == 0) goto LAB_007e4746;
    local_1b0 = compressedBuffer.size;
    iVar1 = 1;
    data = compressedBuffer.data;
  }
  else {
    if (compressionMode != QP_IMAGE_COMPRESSION_MODE_NONE) {
      dVar2 = 0;
      qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n",
               s_qpImageCompressionModeMap[(int)compressionMode].string);
      goto LAB_007e49e6;
    }
LAB_007e4761:
    iVar1 = (4 - (uint)(imageFormat == QP_IMAGE_FORMAT_RGB888)) * width;
    local_1b0 = (size_t)(iVar1 * height);
    if (iVar1 == stride) {
      iVar1 = 0;
    }
    else {
      dVar2 = Buffer_resize(&compressedBuffer,local_1b0);
      if (dVar2 == 0) {
        dVar2 = 0;
        qpPrintf("ERROR: Failed to pack pixels for writing.\n");
        goto LAB_007e49e6;
      }
      uVar3 = 0;
      if (0 < height) {
        uVar3 = (ulong)(uint)height;
      }
      iVar5 = 0;
      iVar6 = 0;
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        memcpy(compressedBuffer.data + iVar5,(void *)((long)data + (long)iVar6),(long)iVar1);
        iVar6 = iVar6 + stride;
        iVar5 = iVar5 + iVar1;
      }
      data = (deUint8 *)0x0;
      iVar1 = 0;
    }
  }
  int32ToString(width,widthStr);
  int32ToString(height,heightStr);
  attribs[0].name = "Name";
  attribs[0].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0].intValue = -0x2a6;
  attribs[0].boolValue = -1;
  attribs[1].name = "Width";
  attribs[1].type = QP_XML_ATTRIBUTE_STRING;
  attribs[1].intValue = -0x2a6;
  attribs[1].boolValue = -1;
  attribs[2].name = "Height";
  attribs[2].type = QP_XML_ATTRIBUTE_STRING;
  attribs[2].intValue = -0x2a6;
  attribs[2].boolValue = -1;
  attribs[3].stringValue = s_qpImageFormatMap[(int)imageFormat].string;
  attribs[3].name = "Format";
  attribs[3].type = QP_XML_ATTRIBUTE_STRING;
  attribs[3].intValue = -0x2a6;
  attribs[3].boolValue = -1;
  attribs[4].name = "CompressionMode";
  attribs[4].type = QP_XML_ATTRIBUTE_STRING;
  attribs[4].stringValue =
       *(char **)((long)&s_qpImageCompressionModeMap[0].string + (ulong)(uint)(iVar1 << 4));
  attribs[4].intValue = -0x2a6;
  attribs[4].boolValue = -1;
  if (description == (char *)0x0) {
    iVar1 = 5;
  }
  else {
    attribs[5].name = "Description";
    attribs[5].type = QP_XML_ATTRIBUTE_STRING;
    attribs[5].intValue = -0x2a6;
    attribs[5].boolValue = -1;
    iVar1 = 6;
    attribs[5].stringValue = description;
  }
  attribs[0].stringValue = name;
  attribs[1].stringValue = widthStr;
  attribs[2].stringValue = heightStr;
  deMutex_lock(log->lock);
  dVar2 = qpXmlWriter_startElement(log->writer,"Image",iVar1,attribs);
  if (((dVar2 == 0) ||
      (dVar2 = qpXmlWriter_writeBase64(log->writer,(deUint8 *)data,local_1b0), dVar2 == 0)) ||
     (dVar2 = qpXmlWriter_endElement(log->writer,"Image"), dVar2 == 0)) {
    dVar2 = 0;
    qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  else {
    deMutex_unlock(log->lock);
    dVar2 = 1;
  }
LAB_007e49e6:
  Buffer_deinit(&compressedBuffer);
  return dVar2;
}

Assistant:

deBool qpTestLog_writeImage	(
	qpTestLog*				log,
	const char*				name,
	const char*				description,
	qpImageCompressionMode	compressionMode,
	qpImageFormat			imageFormat,
	int						width,
	int						height,
	int						stride,
	const void*				data)
{
	char			widthStr[32];
	char			heightStr[32];
	qpXmlAttribute	attribs[8];
	int				numAttribs			= 0;
	Buffer			compressedBuffer;
	const void*		writeDataPtr		= DE_NULL;
	size_t			writeDataBytes		= ~(size_t)0;

	DE_ASSERT(log && name);
	DE_ASSERT(deInRange32(width, 1, 16384));
	DE_ASSERT(deInRange32(height, 1, 16384));
	DE_ASSERT(data);

	if (log->flags & QP_TEST_LOG_EXCLUDE_IMAGES)
		return DE_TRUE; /* Image not logged. */

	Buffer_init(&compressedBuffer);

	/* BEST compression mode defaults to PNG. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_BEST)
	{
#if defined(QP_SUPPORT_PNG)
		compressionMode = QP_IMAGE_COMPRESSION_MODE_PNG;
#else
		compressionMode = QP_IMAGE_COMPRESSION_MODE_NONE;
#endif
	}

#if defined(QP_SUPPORT_PNG)
	/* Try storing with PNG compression. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_PNG)
	{
		deBool compressOk = compressImagePNG(&compressedBuffer, imageFormat, width, height, stride, data);
		if (compressOk)
		{
			writeDataPtr	= compressedBuffer.data;
			writeDataBytes	= compressedBuffer.size;
		}
		else
		{
			/* Fall-back to default compression. */
			qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
			compressionMode	= QP_IMAGE_COMPRESSION_MODE_NONE;
		}
	}
#endif

	/* Handle image compression. */
	switch (compressionMode)
	{
		case QP_IMAGE_COMPRESSION_MODE_NONE:
		{
			int pixelSize		= imageFormat == QP_IMAGE_FORMAT_RGB888 ? 3 : 4;
			int packedStride	= pixelSize*width;

			if (packedStride == stride)
				writeDataPtr = data;
			else
			{
				/* Need to re-pack pixels. */
				if (Buffer_resize(&compressedBuffer, (size_t)(packedStride*height)))
				{
					int row;
					for (row = 0; row < height; row++)
						memcpy(&compressedBuffer.data[packedStride*row], &((const deUint8*)data)[row*stride], (size_t)(pixelSize*width));
				}
				else
				{
					qpPrintf("ERROR: Failed to pack pixels for writing.\n");
					Buffer_deinit(&compressedBuffer);
					return DE_FALSE;
				}
			}

			writeDataBytes = (size_t)(packedStride*height);
			break;
		}

#if defined(QP_SUPPORT_PNG)
		case QP_IMAGE_COMPRESSION_MODE_PNG:
			DE_ASSERT(writeDataPtr); /* Already handled. */
			break;
#endif

		default:
			qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
			Buffer_deinit(&compressedBuffer);
			return DE_FALSE;
	}

	/* Fill in attributes. */
	int32ToString(width, widthStr);
	int32ToString(height, heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Width", widthStr);
	attribs[numAttribs++] = qpSetStringAttrib("Height", heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Format", QP_LOOKUP_STRING(s_qpImageFormatMap, imageFormat));
	attribs[numAttribs++] = qpSetStringAttrib("CompressionMode", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
	if (description) attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* \note Log lock is acquired after compression! */
	deMutex_lock(log->lock);

	/* <Image ID="result" Name="Foobar" Width="640" Height="480" Format="RGB888" CompressionMode="None">base64 data</Image> */
	if (!qpXmlWriter_startElement(log->writer, "Image", numAttribs, attribs) ||
		!qpXmlWriter_writeBase64(log->writer, (const deUint8*)writeDataPtr, writeDataBytes) ||
		!qpXmlWriter_endElement(log->writer, "Image"))
	{
		qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		Buffer_deinit(&compressedBuffer);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);

	/* Free compressed data if allocated. */
	Buffer_deinit(&compressedBuffer);

	return DE_TRUE;
}